

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::MatcherBase<const_std::pair<const_phmap::priv::NonStandardLayout,_int>_&>::
~MatcherBase(MatcherBase<const_std::pair<const_phmap::priv::NonStandardLayout,_int>_&> *this)

{
  MatcherBase<const_std::pair<const_phmap::priv::NonStandardLayout,_int>_&> *this_local;
  
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }